

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_ssm_conv(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  undefined8 uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  float *c;
  undefined1 auVar28 [64];
  ulong local_70;
  int local_40;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1d4b,"fatal error");
  }
  iVar16 = (int)pgVar1->ne[1];
  if (dst->ne[0] == (long)iVar16) {
    if (pgVar1->nb[0] == 4) {
      pgVar2 = dst->src[1];
      if (pgVar2->nb[0] == 4) {
        lVar3 = pgVar1->ne[0];
        sVar4 = pgVar1->nb[1];
        if (sVar4 == lVar3 * 4) {
          uVar5 = dst->ne[2];
          if (0 < (int)uVar5) {
            uVar6 = pgVar2->ne[0];
            uVar7 = dst->ne[1];
            iVar15 = (params->nth + -1 + iVar16) / params->nth;
            iVar25 = params->ith * iVar15;
            local_70 = 0;
            iVar24 = (int)uVar6;
            iVar15 = iVar15 + iVar25;
            lVar19 = (long)iVar25;
            if (iVar16 <= iVar15) {
              iVar15 = iVar16;
            }
            do {
              local_40 = (int)uVar7;
              if (0 < local_40) {
                sVar8 = pgVar2->nb[1];
                sVar9 = dst->nb[2];
                sVar10 = dst->nb[1];
                pvVar11 = pgVar2->data;
                sVar12 = dst->nb[0];
                pvVar13 = dst->data;
                lVar20 = (long)pgVar1->data + pgVar1->nb[2] * local_70 + sVar4 * lVar19;
                uVar17 = 0;
                do {
                  if (0 < iVar15 - iVar25) {
                    uVar22 = 0;
                    pvVar21 = (void *)(sVar8 * lVar19 + (long)pvVar11);
                    lVar27 = lVar20;
                    do {
                      auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
                      if (0 < iVar24) {
                        uVar26 = 0;
                        do {
                          auVar14 = vfmadd231ss_fma(auVar28._0_16_,
                                                    ZEXT416(*(uint *)(lVar27 + uVar26 * 4)),
                                                    ZEXT416(*(uint *)((long)pvVar21 + uVar26 * 4)));
                          auVar28 = ZEXT1664(auVar14);
                          uVar26 = uVar26 + 1;
                        } while ((uVar6 & 0x7fffffff) != uVar26);
                      }
                      *(int *)((long)pvVar13 +
                              uVar22 * 4 + uVar17 * sVar10 + sVar9 * local_70 + sVar12 * lVar19) =
                           auVar28._0_4_;
                      uVar22 = uVar22 + 1;
                      pvVar21 = (void *)((long)pvVar21 + (long)iVar24 * 4);
                      lVar27 = lVar27 + (long)(int)lVar3 * 4;
                    } while (uVar22 != (uint)(iVar15 - iVar25));
                  }
                  uVar17 = uVar17 + 1;
                  lVar20 = lVar20 + 4;
                } while (uVar17 != (uVar7 & 0x7fffffff));
              }
              local_70 = local_70 + 1;
            } while (local_70 != (uVar5 & 0x7fffffff));
          }
          return;
        }
        pcVar18 = "src0->nb[1] == src0->ne[0]*sizeof(float)";
        uVar23 = 0x1d1e;
      }
      else {
        pcVar18 = "src1->nb[0] == sizeof(float)";
        uVar23 = 0x1d1d;
      }
    }
    else {
      pcVar18 = "src0->nb[0] == sizeof(float)";
      uVar23 = 0x1d1c;
    }
  }
  else {
    pcVar18 = "dst->ne[0] == nr";
    uVar23 = 0x1d1b;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar23,"GGML_ASSERT(%s) failed",pcVar18);
}

Assistant:

void ggml_compute_forward_ssm_conv(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_conv_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}